

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  result *extraout_RAX;
  result *prVar4;
  ostringstream os;
  string local_290;
  char *local_270;
  long local_268;
  char local_260 [16];
  result *local_250;
  long local_248;
  undefined1 local_240 [16];
  char *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  bool local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream local_1a8 [376];
  
  iVar1 = rhs->value;
  iVar2 = *(int *)this;
  local_250 = (result *)local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"==","");
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_250,&local_250->passed + local_248);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::logic_t>(&local_290,(logic_t *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_270,local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  to_string<(anonymous_namespace)::logic_t>(&local_1c8,rhs);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  local_230 = local_228._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_290._M_dataplus._M_p,
             local_290._M_dataplus._M_p + local_290._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_230,local_230 + local_228._M_allocated_capacity);
  local_1f0 = iVar2 == iVar1;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1e8,local_210,local_210 + local_208);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e8 + local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_230 != local_228._M_local_buf + 8) {
    operator_delete(local_230);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  prVar4 = (result *)local_240;
  if (local_250 != prVar4) {
    operator_delete(local_250);
    prVar4 = extraout_RAX;
  }
  return prVar4;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }